

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition>::verifyImageData
          (TestStatus *__return_storage_ptr__,
          MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *this,
          VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS)

{
  bool bVar1;
  allocator<char> local_29;
  string local_28;
  
  bVar1 = checkForError(imageRSInfo,dataRS,0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Failed",&local_29);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_28);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Passed",&local_29);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceInterpolateScreenPosition>::verifyImageData (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS) const
{
	if (checkForError(imageRSInfo, dataRS, 0))
		return tcu::TestStatus::fail("Failed");

	return tcu::TestStatus::pass("Passed");
}